

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermConstantUnion * __thiscall
glslang::HlslParseContext::getSamplePosArray(HlslParseContext *this,int count)

{
  float fVar1;
  pointer pTVar2;
  TPoolAllocator *pTVar3;
  TConstUnionArray *this_00;
  TArraySizes *this_01;
  TIntermConstantUnion *this_02;
  long lVar4;
  tSamplePos *ptVar5;
  uint uVar6;
  TType retType;
  TType local_b8;
  
  uVar6 = count;
  switch(count - 2U >> 1 | (uint)((count - 2U & 1) != 0) << 0x1f) {
  case 0:
    ptVar5 = getSamplePosArray::pos2;
    break;
  case 1:
    ptVar5 = getSamplePosArray::pos4;
    break;
  default:
    ptVar5 = getSamplePosArray::pos1;
    uVar6 = 1;
    break;
  case 3:
    ptVar5 = getSamplePosArray::pos8;
    break;
  case 7:
    ptVar5 = getSamplePosArray::pos16;
  }
  pTVar3 = GetThreadPoolAllocator();
  this_00 = (TConstUnionArray *)TPoolAllocator::allocate(pTVar3,0x10);
  TConstUnionArray::TConstUnionArray(this_00,uVar6 * 2);
  if (0 < count) {
    lVar4 = 0;
    do {
      fVar1 = *(float *)((long)&ptVar5->y + lVar4);
      pTVar2 = (this_00->unionArray->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(double *)((long)&pTVar2->field_0 + lVar4 * 4) = (double)*(float *)((long)&ptVar5->x + lVar4)
      ;
      (&pTVar2->type)[lVar4] = EbtDouble;
      pTVar2 = (this_00->unionArray->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(double *)((long)&pTVar2[1].field_0 + lVar4 * 4) = (double)fVar1;
      (&pTVar2[1].type)[lVar4] = EbtDouble;
      lVar4 = lVar4 + 8;
    } while ((ulong)(uint)count << 3 != lVar4);
  }
  TType::TType(&local_b8,EbtFloat,EvqConst,2,0,0,false);
  if (uVar6 != 1) {
    pTVar3 = GetThreadPoolAllocator();
    this_01 = (TArraySizes *)TPoolAllocator::allocate(pTVar3,0x18);
    (this_01->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00b092a0;
    (this_01->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    this_01->implicitArraySize = 0;
    this_01->implicitlySized = true;
    this_01->variablyIndexed = false;
    TSmallArrayVector::push_back((TSmallArrayVector *)this_01,uVar6,(TIntermTyped *)0x0);
    local_b8.arraySizes = this_01;
  }
  pTVar3 = GetThreadPoolAllocator();
  this_02 = (TIntermConstantUnion *)TPoolAllocator::allocate(pTVar3,0xd0);
  TIntermTyped::TIntermTyped((TIntermTyped *)this_02,&local_b8);
  (this_02->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode =
       (_func_int **)&PTR_getLoc_00b0f6d0;
  (this_02->constArray)._vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_00b09280;
  (this_02->constArray).unionArray = this_00->unionArray;
  this_02->literal = false;
  return this_02;
}

Assistant:

TIntermConstantUnion* HlslParseContext::getSamplePosArray(int count)
{
    struct tSamplePos { float x, y; };

    static const tSamplePos pos1[] = {
        { 0.0/16.0,  0.0/16.0 },
    };

    // standard sample positions for 2, 4, 8, and 16 samples.
    static const tSamplePos pos2[] = {
        { 4.0/16.0,  4.0/16.0 }, {-4.0/16.0, -4.0/16.0 },
    };

    static const tSamplePos pos4[] = {
        {-2.0/16.0, -6.0/16.0 }, { 6.0/16.0, -2.0/16.0 }, {-6.0/16.0,  2.0/16.0 }, { 2.0/16.0,  6.0/16.0 },
    };

    static const tSamplePos pos8[] = {
        { 1.0/16.0, -3.0/16.0 }, {-1.0/16.0,  3.0/16.0 }, { 5.0/16.0,  1.0/16.0 }, {-3.0/16.0, -5.0/16.0 },
        {-5.0/16.0,  5.0/16.0 }, {-7.0/16.0, -1.0/16.0 }, { 3.0/16.0,  7.0/16.0 }, { 7.0/16.0, -7.0/16.0 },
    };

    static const tSamplePos pos16[] = {
        { 1.0/16.0,  1.0/16.0 }, {-1.0/16.0, -3.0/16.0 }, {-3.0/16.0,  2.0/16.0 }, { 4.0/16.0, -1.0/16.0 },
        {-5.0/16.0, -2.0/16.0 }, { 2.0/16.0,  5.0/16.0 }, { 5.0/16.0,  3.0/16.0 }, { 3.0/16.0, -5.0/16.0 },
        {-2.0/16.0,  6.0/16.0 }, { 0.0/16.0, -7.0/16.0 }, {-4.0/16.0, -6.0/16.0 }, {-6.0/16.0,  4.0/16.0 },
        {-8.0/16.0,  0.0/16.0 }, { 7.0/16.0, -4.0/16.0 }, { 6.0/16.0,  7.0/16.0 }, {-7.0/16.0, -8.0/16.0 },
    };

    const tSamplePos* sampleLoc = nullptr;
    int numSamples = count;

    switch (count) {
    case 2:  sampleLoc = pos2;  break;
    case 4:  sampleLoc = pos4;  break;
    case 8:  sampleLoc = pos8;  break;
    case 16: sampleLoc = pos16; break;
    default:
        sampleLoc = pos1;
        numSamples = 1;
    }

    TConstUnionArray* values = new TConstUnionArray(numSamples*2);

    for (int pos=0; pos<count; ++pos) {
        TConstUnion x, y;
        x.setDConst(sampleLoc[pos].x);
        y.setDConst(sampleLoc[pos].y);

        (*values)[pos*2+0] = x;
        (*values)[pos*2+1] = y;
    }

    TType retType(EbtFloat, EvqConst, 2);

    if (numSamples != 1) {
        TArraySizes* arraySizes = new TArraySizes;
        arraySizes->addInnerSize(numSamples);
        retType.transferArraySizes(arraySizes);
    }

    return new TIntermConstantUnion(*values, retType);
}